

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

void lookup_symbol(char sym,char *buf,size_t max)

{
  _Bool _Var1;
  int iVar2;
  char *pcVar3;
  ushort **ppuVar4;
  monster_base *local_30;
  monster_base *race;
  wchar_t i;
  size_t max_local;
  char *buf_local;
  char sym_local;
  
  for (race._4_4_ = 0; race._4_4_ < (int)(uint)z_info->k_max; race._4_4_ = race._4_4_ + 1) {
    _Var1 = char_matches_key(k_info[race._4_4_].d_char,(int)sym);
    if (_Var1) {
      pcVar3 = tval_find_name(k_info[race._4_4_].tval);
      strnfmt(buf,max,"%c - %s.",(ulong)(uint)(int)sym,pcVar3);
      return;
    }
  }
  for (race._4_4_ = 1; race._4_4_ < 0x19; race._4_4_ = race._4_4_ + 1) {
    _Var1 = char_matches_key(f_info[race._4_4_].d_char,(int)sym);
    if (_Var1) {
      strnfmt(buf,max,"%c - %s.",(ulong)(uint)(int)sym,f_info[race._4_4_].name);
      return;
    }
  }
  local_30 = rb_info;
  while( true ) {
    if (local_30 == (monster_base *)0x0) {
      ppuVar4 = __ctype_b_loc();
      if (((*ppuVar4)[(int)sym] & 0x4000) == 0) {
        strnfmt(buf,max,"? - Unknown Symbol.");
      }
      else {
        strnfmt(buf,max,"%c - Unknown Symbol.",(ulong)(uint)(int)sym);
      }
      return;
    }
    iVar2 = strcmp(local_30->name,"Morgoth");
    if ((iVar2 != 0) && (_Var1 = char_matches_key(local_30->d_char,(int)sym), _Var1)) break;
    local_30 = local_30->next;
  }
  strnfmt(buf,max,"%c - %s.",(ulong)(uint)(int)sym,local_30->text);
  return;
}

Assistant:

static void lookup_symbol(char sym, char *buf, size_t max)
{
	int i;
	struct monster_base *race;

	/* Look through items */
	/* Note: We currently look through all items, and grab the tval when we
	 * find a match.
	 * It would make more sense to loop through tvals, but then we need to
	 * associate a display character with each tval. */
	for (i = 0; i < z_info->k_max; i++) {
		if (char_matches_key(k_info[i].d_char, sym)) {
			strnfmt(buf, max, "%c - %s.", sym, tval_find_name(k_info[i].tval));
			return;
		}
	}

	/* Look through features */
	/* Note: We need a better way of doing this. Currently '#' matches secret
	 * door, and '^' matches trap door (instead of the more generic "trap"). */
	for (i = 1; i < FEAT_MAX; i++) {
		if (char_matches_key(f_info[i].d_char, sym)) {
			strnfmt(buf, max, "%c - %s.", sym, f_info[i].name);
			return;
		}
	}
	
	/* Look through monster templates */
	for (race = rb_info; race; race = race->next) {
		/* Slight hack - P appears twice */
		if (streq(race->name, "Morgoth")) continue;
		if (char_matches_key(race->d_char, sym)) {
			strnfmt(buf, max, "%c - %s.", sym, race->text);
			return;
		}
	}

	/* No matches */
        if (isprint(sym)) {
			strnfmt(buf, max, "%c - Unknown Symbol.", sym);
        } else {
			strnfmt(buf, max, "? - Unknown Symbol.");
        }
	
	return;
}